

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O0

void __thiscall Response::decode_url(Response *this,iterator dst,char *src)

{
  char cVar1;
  int iVar2;
  reference pcVar3;
  char *in_RDX;
  char b;
  char a;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc0;
  int iVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  char local_1a;
  char local_19;
  char *local_18;
  
  local_18 = in_RDX;
  while (iVar4 = (int)((ulong)in_stack_ffffffffffffffc0._M_current >> 0x20), *local_18 != '\0') {
    if ((((*local_18 == '%') && (local_19 = local_18[1], local_19 != '\0')) &&
        (local_1a = local_18[2], local_1a != '\0')) &&
       ((iVar2 = isxdigit((int)local_19), iVar2 != 0 &&
        (iVar2 = isxdigit((int)local_1a), iVar2 != 0)))) {
      if ('`' < local_19) {
        local_19 = local_19 + -0x20;
      }
      if (local_19 < 'A') {
        local_19 = local_19 + -0x30;
      }
      else {
        local_19 = local_19 + -0x37;
      }
      if ('`' < local_1a) {
        local_1a = local_1a + -0x20;
      }
      if (local_1a < 'A') {
        local_1a = local_1a + -0x30;
      }
      else {
        local_1a = local_1a + -0x37;
      }
      cVar1 = local_19 * '\x10' + local_1a;
      local_28 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(in_stack_ffffffffffffffc8._M_current,iVar4);
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_28);
      *pcVar3 = cVar1;
      local_18 = local_18 + 3;
    }
    else if (*local_18 == '+') {
      local_30 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(in_stack_ffffffffffffffc8._M_current,iVar4);
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_30);
      *pcVar3 = ' ';
      local_18 = local_18 + 1;
    }
    else {
      cVar1 = *local_18;
      local_18 = local_18 + 1;
      in_stack_ffffffffffffffc8 =
           __gnu_cxx::
           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator++(in_stack_ffffffffffffffc8._M_current,iVar4);
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&stack0xffffffffffffffc8);
      *pcVar3 = cVar1;
    }
  }
  __gnu_cxx::
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffffc8._M_current,iVar4);
  pcVar3 = __gnu_cxx::
           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stack0xffffffffffffffc0);
  *pcVar3 = '\0';
  return;
}

Assistant:

void Response::decode_url(std::string::iterator dst, const char *src) const {
    char a, b;
    while (*src) {
        if ((*src == '%') &&
            ((a = src[1]) && (b = src[2])) &&
            (isxdigit(a) && isxdigit(b))) {
                if (a >= 'a')
                        a -= 'a'-'A';
                if (a >= 'A')
                        a -= ('A' - 10);
                else
                        a -= '0';
                if (b >= 'a')
                        b -= 'a'-'A';
                if (b >= 'A')
                        b -= ('A' - 10);
                else
                        b -= '0';
                *dst++ = 16*a+b;
                src+=3;
        } else if (*src == '+') {
                *dst++ = ' ';
                src++;
        } else {
                *dst++ = *src++;
        }
    }
    *dst++ = '\0';
}